

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O0

size_t woff2::FontFileSize(Font *font)

{
  bool bVar1;
  unsigned_long *puVar2;
  unsigned_long local_50;
  size_t end_offset;
  size_t padding_size;
  Table *table;
  pair<const_unsigned_int,_woff2::Font::Table> *i;
  const_iterator __end1;
  const_iterator __begin1;
  map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
  *__range1;
  size_t max_offset;
  Font *font_local;
  
  __range1 = (map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
              *)((ulong)font->num_tables * 0x10 + 0xc);
  max_offset = (size_t)font;
  __end1 = std::
           map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
           ::begin(&font->tables);
  i = (pair<const_unsigned_int,_woff2::Font::Table> *)
      std::
      map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
      ::end(&font->tables);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&i);
    if (!bVar1) break;
    table = (Table *)std::
                     _Rb_tree_const_iterator<std::pair<const_unsigned_int,_woff2::Font::Table>_>::
                     operator*(&__end1);
    padding_size = (size_t)&((reference)table)->second;
    end_offset = (size_t)(4 - ((((reference)table)->second).length & 3) & 3);
    local_50 = end_offset + (((reference)table)->second).offset +
               (ulong)(((reference)table)->second).length;
    puVar2 = std::max<unsigned_long>((unsigned_long *)&__range1,&local_50);
    __range1 = (map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                *)*puVar2;
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_woff2::Font::Table>_>::operator++
              (&__end1);
  }
  return (size_t)__range1;
}

Assistant:

size_t FontFileSize(const Font& font) {
  size_t max_offset = 12ULL + 16ULL * font.num_tables;
  for (const auto& i : font.tables) {
    const Font::Table& table = i.second;
    size_t padding_size = (4 - (table.length & 3)) & 3;
    size_t end_offset = (padding_size + table.offset) + table.length;
    max_offset = std::max(max_offset, end_offset);
  }
  return max_offset;
}